

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Aggregate_State_PDU
          (Aggregate_State_PDU *this,AggregateIdentifier *AI,ForceID FID,AggregateState AS,
          AggregateType *AT,Formation F,AggregateMarking *AM,Vector *Dimensions,
          EulerAngles *Orientation,WorldCoordinates *CenterOfMass,Vector *Velocity)

{
  Formation F_local;
  AggregateType *AT_local;
  AggregateState AS_local;
  ForceID FID_local;
  AggregateIdentifier *AI_local;
  Aggregate_State_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Aggregate_State_PDU_0032e8d8;
  DATA_TYPE::AggregateIdentifier::AggregateIdentifier(&this->m_AggregateID,AI);
  this->m_ui8ForceID = (KUINT8)FID;
  this->m_ui8AggState = (KUINT8)AS;
  DATA_TYPE::AggregateType::AggregateType(&this->m_AggregateType,AT);
  this->m_ui32Formation = F;
  DATA_TYPE::AggregateMarking::AggregateMarking(&this->m_AggregateMarking,AM);
  DATA_TYPE::Vector::Vector(&this->m_Dimensions,Dimensions);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_CtrOfMassLoc,CenterOfMass);
  DATA_TYPE::Vector::Vector(&this->m_Vel,Velocity);
  this->m_ui16NumAggregates = 0;
  this->m_ui16NumEntities = 0;
  this->m_ui16NumSilentAggregateTypes = 0;
  this->m_ui16NumSilentEntityTypes = 0;
  std::
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ::vector(&this->m_vAI);
  std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ::vector(&this->m_vEI);
  this->m_bNeedsPadding = false;
  this->m_ui16Padding1 = 0;
  this->m_ui16NumberOfPaddingOctets = 0;
  std::
  vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ::vector(&this->m_vSASL);
  std::
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ::vector(&this->m_vSESL);
  this->m_ui32NumVariableDatum = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::vector(&this->m_vVD);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Header).super_Header6.m_ui8PDUType = '!';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x88;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Aggregate_State_PDU::Aggregate_State_PDU( const AggregateIdentifier & AI, ForceID FID, AggregateState AS,
        const AggregateType & AT, Formation F, const AggregateMarking & AM,
        const Vector & Dimensions, const EulerAngles & Orientation,
        const WorldCoordinates & CenterOfMass, const Vector & Velocity ) :
    m_AggregateID( AI ),
    m_ui8ForceID( FID ),
    m_ui8AggState( AS ),
    m_AggregateType( AT ),
    m_ui32Formation( F ),
    m_AggregateMarking( AM ),
    m_Dimensions( Dimensions ),
    m_Ori( Orientation ),
    m_CtrOfMassLoc( CenterOfMass ),
    m_Vel( Velocity ),
    m_ui16NumAggregates( 0 ),
    m_ui16NumEntities( 0 ),
    m_ui16NumSilentAggregateTypes( 0 ),
    m_ui16NumSilentEntityTypes( 0 ),
    m_bNeedsPadding( false ),
    m_ui16Padding1( 0 ),
    m_ui16NumberOfPaddingOctets( 0 ),
    m_ui32NumVariableDatum( 0 )
{
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = AggregateState_PDU_Type;
    m_ui16PDULength = AGGREGATE_STATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}